

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsp_launcher.cpp
# Opt level: O2

void lscpp::launch(lsp_server *server,launch_config *config,transporter *transporter_)

{
  pointer p_Var1;
  _Result<void> *p_Var2;
  __state_type *__state;
  _State_baseV2 *__tmp;
  undefined2 local_9c;
  undefined1 local_9a;
  __allocator_type __a2;
  __state_type local_98;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_havogt[P]cmakels_lscpp_src_lsp_launcher_cpp:47:45)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_havogt[P]cmakels_lscpp_src_lsp_launcher_cpp:47:45)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_88;
  element_type *local_78;
  thread local_70;
  __allocator_type __a2_1;
  future<void> rcv;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  local_88._M_alloc =
       (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_havogt[P]cmakels_lscpp_src_lsp_launcher_cpp:47:45)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_havogt[P]cmakels_lscpp_src_lsp_launcher_cpp:47:45)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
        *)(long)config->startup_delay;
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>
            ((duration<long,_std::ratio<1L,_1L>_> *)&local_88);
  local_9c = 0;
  local_9a = 0;
  loguru::g_stderr_verbosity = 0xfffffff7;
  loguru::g_colorlogtostderr = 0;
  if ((config->logger).filename._M_string_length != 0) {
    loguru::add_file((config->logger).filename._M_dataplus._M_p,Truncate,(config->logger).verbosity)
    ;
  }
  local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (pointer)operator_new(0x60);
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_005caef0;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 8) = 0;
  *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x10) = 0;
  (p_Var1->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
  *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x18) = 0;
  local_88._M_alloc = &__a2;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x20) = 0;
  *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x28) = 0;
  (p_Var1->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_005caf40;
  local_88._M_ptr = p_Var1;
  local_78 = (element_type *)&p_Var1->_M_impl;
  p_Var2 = (_Result<void> *)operator_new(0x10);
  *(undefined8 *)p_Var2 = 0;
  *(undefined8 *)&p_Var2->field_0x8 = 0;
  std::__future_base::_Result<void>::_Result(p_Var2);
  *(_Result<void> **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x30) = p_Var2;
  *(transporter **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x38) = transporter_;
  *(undefined2 **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x40) = &local_9c;
  *(lsp_server **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x48) = server;
  local_70._M_id._M_thread = (id)0;
  ___a2_1 = (long *)operator_new(0x20);
  *___a2_1 = (long)&PTR___State_005caf98;
  ___a2_1[1] = (long)&p_Var1->_M_impl;
  ___a2_1[2] = (long)std::__future_base::
                     _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/src/lsp_launcher.cpp:47:45)>_>,_void>
                     ::_M_run;
  ___a2_1[3] = 0;
  std::thread::_M_start_thread(&local_70,&__a2_1,0);
  if (___a2_1 != (long *)0x0) {
    (**(code **)(*___a2_1 + 8))();
  }
  std::thread::operator=
            ((thread *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x20),&local_70);
  std::thread::~thread(&local_70);
  local_88._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/src/lsp_launcher.cpp:47:45)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/src/lsp_launcher.cpp:47:45)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_88);
  local_88._M_alloc =
       (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_havogt[P]cmakels_lscpp_src_lsp_launcher_cpp:47:45)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_havogt[P]cmakels_lscpp_src_lsp_launcher_cpp:47:45)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
        *)local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_78;
  local_88._M_ptr =
       (pointer)local_98.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  if (local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    p_Var1 = (pointer)operator_new(0x50);
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_005cafd8;
    *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 8) = 0;
    *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x10) = 0;
    (p_Var1->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
    *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x18) = 0;
    (p_Var1->_M_impl)._M_storage._M_storage.__align =
         (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_005cb028;
    local_88._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_havogt[P]cmakels_lscpp_src_lsp_launcher_cpp:47:45)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_havogt[P]cmakels_lscpp_src_lsp_launcher_cpp:47:45)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
          *)&__a2_1;
    local_88._M_ptr = p_Var1;
    p_Var2 = (_Result<void> *)operator_new(0x10);
    *(undefined8 *)p_Var2 = 0;
    *(undefined8 *)&p_Var2->field_0x8 = 0;
    std::__future_base::_Result<void>::_Result(p_Var2);
    *(_Result<void> **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x20) = p_Var2;
    *(transporter **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x28) = transporter_;
    *(undefined2 **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x30) = &local_9c;
    *(lsp_server **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x38) = server;
    local_88._M_ptr = (pointer)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/src/lsp_launcher.cpp:47:45)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/src/lsp_launcher.cpp:47:45)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_havogt[P]cmakels_lscpp_src_lsp_launcher_cpp:47:45)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_havogt[P]cmakels_lscpp_src_lsp_launcher_cpp:47:45)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&local_88);
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_havogt[P]cmakels_lscpp_src_lsp_launcher_cpp:47:45)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_havogt[P]cmakels_lscpp_src_lsp_launcher_cpp:47:45)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
          *)local_98.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_88._M_ptr =
         (pointer)local_98.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)&p_Var1->_M_impl;
    local_98.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  }
  __state = &local_98;
  std::__basic_future<void>::__basic_future(&rcv.super___basic_future<void>,__state);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__basic_future<void>::wait(&rcv.super___basic_future<void>,__state);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rcv.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void launch(lsp_server &&server, launch_config config,
            transporter &&transporter_) {

  // Allows to attach a debugger,
  // before the language server starts to communicate with the client.
  std::this_thread::sleep_for(std::chrono::seconds(config.startup_delay));

  // If we want to play with different message handlers, we can revert to a
  // templated launch (or duplicate the launch as long as it is simple)
  lsp_message_handler message_handler{};

  // setup logger
  loguru::g_stderr_verbosity = loguru::Verbosity_OFF;
  loguru::g_colorlogtostderr = false;
  if (config.logger.filename.size() > 0)
    loguru::add_file(config.logger.filename.c_str(), loguru::Truncate,
                     config.logger.verbosity);

  auto rcv = std::async(std::launch::async, [&]() {
    while (true) {
      auto header = parse_header(transporter_);
      LOG_F(INFO, "content-length: '%d'", header.content_length);
      if (header.content_length <
          0) { // TODO parse header should not use -1 to report an error
        continue;
      }
      auto msg = transporter_.read_message(header.content_length);
      LOG_F(INFO, "msg: '%s'", msg.c_str());

      auto result = message_handler.handle_message(server, msg);
      if (result) {
        LOG_F(INFO, "Sending response: '%s'", (*result).c_str());
        write_lsp_message(transporter_, *result);
      }
    }
  });

  rcv.wait();
}